

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::SelectGenericLoopSelSwitch<double,double,duckdb::GreaterThan,true>
                (double *ldata,double *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  SelectionVector *pSVar8;
  idx_t iVar9;
  idx_t iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t local_50;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar11 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar11 = 0;
        uVar13 = 0;
        do {
          uVar12 = uVar13;
          if (psVar1 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar1[uVar13];
          }
          uVar5 = uVar13;
          if (psVar2 != (sel_t *)0x0) {
            uVar5 = (ulong)psVar2[uVar13];
          }
          uVar7 = uVar13;
          if (psVar3 != (sel_t *)0x0) {
            uVar7 = (ulong)psVar3[uVar13];
          }
          bVar4 = GreaterThan::Operation<double>(ldata + uVar5,rdata + uVar7);
          if (!bVar4) {
            false_sel->sel_vector[lVar11] = (sel_t)uVar12;
            lVar11 = lVar11 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (count != uVar13);
      }
      return count - lVar11;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_50 = 0;
      uVar13 = 0;
      do {
        uVar12 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar1[uVar13];
        }
        uVar5 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar2[uVar13];
        }
        uVar7 = uVar13;
        if (psVar3 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar3[uVar13];
        }
        bVar4 = GreaterThan::Operation<double>(ldata + uVar5,rdata + uVar7);
        if (bVar4) {
          true_sel->sel_vector[local_50] = (sel_t)uVar12;
          local_50 = local_50 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
      return local_50;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_50 = 0;
    uVar13 = 0;
    iVar9 = 0;
    do {
      uVar12 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar1[uVar13];
      }
      uVar5 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[uVar13];
      }
      uVar7 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar3[uVar13];
      }
      bVar4 = GreaterThan::Operation<double>(ldata + uVar5,rdata + uVar7);
      if (bVar4) {
        iVar6 = local_50;
        pSVar8 = true_sel;
        iVar10 = iVar9;
        local_50 = local_50 + 1;
      }
      else {
        iVar10 = iVar9 + 1;
        iVar6 = iVar9;
        pSVar8 = false_sel;
      }
      pSVar8->sel_vector[iVar6] = (sel_t)uVar12;
      uVar13 = uVar13 + 1;
      iVar9 = iVar10;
    } while (count != uVar13);
    return local_50;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}